

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericBlendersTests.cpp
# Opt level: O2

void __thiscall
agge::tests::GenericRGBXBlenderTests::BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover
          (GenericRGBXBlenderTests *this)

{
  color cVar1;
  long lVar2;
  uint8_t covers [7];
  allocator local_a1;
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>
  blackness;
  pixel dest [7];
  pixel reference [7];
  LocationInfo local_58;
  string local_30;
  
  covers[4] = 0x81;
  covers[5] = 0xf0;
  covers[6] = 0xff;
  covers[0] = '\0';
  covers[1] = '\x12';
  covers[2] = '!';
  covers[3] = 'q';
  cVar1 = color::make('\0','\0','\0',0xff);
  blackness._color._0_2_ = cVar1._0_2_;
  blackness._color.b = cVar1.b;
  blackness._color.a = cVar1.a;
  blackness._a = (((uint)cVar1 >> 0x18) * 0x1f9) / 1000 + ((uint)cVar1 >> 0x18) * 0x40;
  for (lVar2 = 0; lVar2 != 0x1c; lVar2 = lVar2 + 4) {
    *(undefined4 *)(dest[0].components + lVar2) = 0xffffffff;
  }
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest,0,0,1,covers);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest + 1,0,0,1,covers + 1);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest + 2,0,0,1,covers + 2);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest + 3,0,0,1,covers + 3);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest + 4,0,0,1,covers + 4);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest + 5,0,0,1,covers + 5);
  blender_solid_color_rgb<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,_agge::order_rgba>::
  operator()(&blackness,dest + 6,0,0,1,covers + 6);
  builtin_memcpy(reference[4].components,"~~~~",4);
  builtin_memcpy(reference[5].components,"\x0f\x0f\x0f\x0f",4);
  reference[6].components[0] = '\0';
  reference[6].components[1] = '\0';
  reference[6].components[2] = '\0';
  reference[6].components[3] = '\0';
  reference[0].components[0] = 0xff;
  reference[0].components[1] = 0xff;
  reference[0].components[2] = 0xff;
  reference[0].components[3] = 0xff;
  reference[1].components[0] = 0xed;
  reference[1].components[1] = 0xed;
  reference[1].components[2] = 0xed;
  reference[1].components[3] = 0xed;
  reference[2].components[0] = 0xde;
  reference[2].components[1] = 0xde;
  reference[2].components[2] = 0xde;
  reference[2].components[3] = 0xde;
  reference[3].components[0] = 0x8e;
  reference[3].components[1] = 0x8e;
  reference[3].components[2] = 0x8e;
  reference[3].components[3] = 0x8e;
  std::__cxx11::string::string
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/GenericBlendersTests.cpp"
             ,&local_a1);
  ut::LocationInfo::LocationInfo(&local_58,&local_30,99);
  ut::
  are_equal<agge::tests::mocks::pixel_rgbx<agge::order_rgba>,agge::tests::mocks::pixel_rgbx<agge::order_rgba>,7ul>
            (&reference,&dest,&local_58);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( BlendingBlackOnWhiteProducesGrayDependingOnInvertedCover )
			{
				typedef mocks::pixel_rgbx<order_rgba> pixel;

				// INIT
				const int n = 7;
				const pixel white = { { 0xFF, 0xFF, 0xFF, 0xFF } };
				const uint8_t covers[n] = { 0x00, 0x12, 0x21, 0x71, 0x81, 0xF0, 0xFF };
				blender_solid_color_rgb<pixel, order_rgba> blackness(color::make(0x00, 0x00, 0x00));
				pixel dest[n];

				fill_n(dest, n, white);

				// ACT
				blackness(dest + 0, 0, 0, 1, covers + 0);
				blackness(dest + 1, 0, 0, 1, covers + 1);
				blackness(dest + 2, 0, 0, 1, covers + 2);
				blackness(dest + 3, 0, 0, 1, covers + 3);
				blackness(dest + 4, 0, 0, 1, covers + 4);
				blackness(dest + 5, 0, 0, 1, covers + 5);
				blackness(dest + 6, 0, 0, 1, covers + 6);

				// ASSERT
				pixel reference[] = {
					{ { 0xFF, 0xFF, 0xFF, 0xFF } },
					{ { 0xED, 0xED, 0xED, 0xED } },
					{ { 0xDE, 0xDE, 0xDE, 0xDE } },
					{ { 0x8E, 0x8E, 0x8E, 0x8E } },
					{ { 0x7E, 0x7E, 0x7E, 0x7E } },
					{ { 0x0F, 0x0F, 0x0F, 0x0F } },
					{ { 0x00, 0x00, 0x00, 0x00 } },
				};

				assert_equal(reference, dest);
			}